

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

TypeID NULLCTypeInfo::GetType(NULLCArray name)

{
  uint uVar1;
  uint uVar2;
  TypeID TVar3;
  ExternTypeInfo *pEVar4;
  uint local_30;
  uint i;
  uint hash;
  NULLCArray name_local;
  
  if (name.ptr == (char *)0x0) {
    name_local.ptr._4_4_ = getTypeID(0);
  }
  else {
    uVar1 = NULLC::GetStringHash(name.ptr);
    for (local_30 = 0;
        uVar2 = FastVector<ExternTypeInfo,_false,_false>::size
                          ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200)),
        local_30 < uVar2; local_30 = local_30 + 1) {
      pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),local_30);
      if (pEVar4->nameHash == uVar1) {
        TVar3 = getTypeID(local_30);
        return (TypeID)TVar3.typeID;
      }
    }
    name_local.ptr._4_4_ = getTypeID(0);
  }
  return (TypeID)name_local.ptr._4_4_;
}

Assistant:

TypeID GetType(NULLCArray name)
	{
		if(!name.ptr)
			return getTypeID(0);

		unsigned hash = NULLC::GetStringHash(name.ptr);

		for(unsigned i = 0; i < linker->exTypes.size(); i++)
		{
			if(linker->exTypes[i].nameHash == hash)
				return getTypeID(i);
		}
		return getTypeID(0);
	}